

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::down_heap
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint pos)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  vq_node *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  puVar3 = (this->m_heap).m_p;
  uVar2 = puVar3[pos];
  uVar8 = pos * 2;
  uVar7 = this->m_heap_size;
  uVar6 = (ulong)pos;
  if (uVar8 <= uVar7) {
    pvVar4 = (this->m_nodes).m_p;
    fVar1 = pvVar4[uVar2].m_variance;
    do {
      uVar5 = (ulong)uVar8;
      uVar9 = uVar8;
      if (uVar8 < uVar7) {
        uVar8 = uVar8 | 1;
        if (pvVar4[puVar3[uVar5]].m_variance <= pvVar4[puVar3[uVar8]].m_variance &&
            pvVar4[puVar3[uVar8]].m_variance != pvVar4[puVar3[uVar5]].m_variance) {
          uVar5 = (ulong)uVar8;
          uVar9 = uVar8;
        }
      }
      uVar6 = (ulong)pos;
      if (pvVar4[puVar3[uVar5]].m_variance <= fVar1 && fVar1 != pvVar4[puVar3[uVar5]].m_variance)
      break;
      puVar3[pos] = puVar3[uVar5];
      uVar8 = uVar9 * 2;
      uVar7 = this->m_heap_size;
      uVar6 = uVar5;
      pos = uVar9;
    } while (uVar8 <= uVar7);
  }
  puVar3[uVar6] = uVar2;
  return;
}

Assistant:

void down_heap(uint pos)
        {
            uint child;
            uint orig = m_heap[pos];

            const float orig_variance = m_nodes[orig].m_variance;

            while ((child = (pos << 1)) <= m_heap_size)
            {
                if (child < m_heap_size)
                {
                    if (m_nodes[m_heap[child]].m_variance < m_nodes[m_heap[child + 1]].m_variance)
                    {
                        child++;
                    }
                }

                if (orig_variance > m_nodes[m_heap[child]].m_variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[child];

                pos = child;
            }

            m_heap[pos] = orig;
        }